

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O0

void __thiscall
UnicodeFullTest_find_Test<std::pair<char8_t,_char>_>::TestBody
          (UnicodeFullTest_find_Test<std::pair<char8_t,_char>_> *this)

{
  bool bVar1;
  char *pcVar2;
  char32_t (*in_RDX) [5];
  char32_t (*in_string) [1];
  char32_t (*in_string_00) [2];
  char32_t (*in_string_01) [2];
  char32_t (*in_string_02) [2];
  char32_t (*in_string_03) [2];
  char32_t (*in_string_04) [2];
  char32_t (*in_string_05) [3];
  char32_t (*in_string_06) [3];
  char32_t (*in_string_07) [3];
  char32_t (*in_string_08) [3];
  char32_t (*in_string_09) [9];
  char32_t (*in_string_10) [2];
  char32_t (*in_string_11) [2];
  char32_t (*in_string_12) [2];
  char32_t (*in_string_13) [2];
  char32_t (*in_string_14) [2];
  char32_t (*in_string_15) [3];
  char32_t (*in_string_16) [3];
  char32_t (*in_string_17) [3];
  char32_t (*in_string_18) [3];
  char32_t (*in_string_19) [3];
  char32_t (*in_string_20) [3];
  char32_t (*in_string_21) [3];
  char32_t (*in_string_22) [3];
  AssertHelper local_768 [8];
  Message local_760 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_758;
  size_t local_738;
  undefined1 local_730 [8];
  AssertionResult gtest_ar_22;
  Message local_718 [12];
  int local_70c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_708;
  size_t local_6e8;
  undefined1 local_6e0 [8];
  AssertionResult gtest_ar_21;
  Message local_6c8 [12];
  int local_6bc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b8;
  size_t local_698;
  undefined1 local_690 [8];
  AssertionResult gtest_ar_20;
  Message local_678 [12];
  int local_66c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  size_t local_648;
  undefined1 local_640 [8];
  AssertionResult gtest_ar_19;
  Message local_628 [12];
  int local_61c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  size_t local_5f8;
  undefined1 local_5f0 [8];
  AssertionResult gtest_ar_18;
  Message local_5d8 [12];
  int local_5cc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  size_t local_5a8;
  undefined1 local_5a0 [8];
  AssertionResult gtest_ar_17;
  Message local_588 [12];
  int local_57c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  size_t local_558;
  undefined1 local_550 [8];
  AssertionResult gtest_ar_16;
  Message local_538 [12];
  int local_52c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  size_t local_508;
  undefined1 local_500 [8];
  AssertionResult gtest_ar_15;
  Message local_4e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  size_t local_4c0;
  undefined1 local_4b8 [8];
  AssertionResult gtest_ar_14;
  Message local_4a0 [12];
  int local_494;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  size_t local_470;
  undefined1 local_468 [8];
  AssertionResult gtest_ar_13;
  Message local_450 [12];
  int local_444;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  size_t local_420;
  undefined1 local_418 [8];
  AssertionResult gtest_ar_12;
  Message local_400 [12];
  int local_3f4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  size_t local_3d0;
  undefined1 local_3c8 [8];
  AssertionResult gtest_ar_11;
  Message local_3b0 [12];
  int local_3a4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  size_t local_380;
  undefined1 local_378 [8];
  AssertionResult gtest_ar_10;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> double_abcd_str;
  Message local_340 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  size_t local_318;
  undefined1 local_310 [8];
  AssertionResult gtest_ar_9;
  Message local_2f8 [12];
  int local_2ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  size_t local_2c8;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar_8;
  Message local_2a8 [12];
  int local_29c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  size_t local_278;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_7;
  Message local_258 [12];
  int local_24c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  size_t local_228;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_6;
  Message local_208 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  size_t local_1e0;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_5;
  Message local_1c0 [12];
  int local_1b4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  size_t local_190;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_4;
  Message local_170 [12];
  int local_164;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  size_t local_140;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_3;
  Message local_120 [12];
  int local_114;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  size_t local_f0;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_2;
  Message local_d0 [12];
  int local_c4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  size_t local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_1;
  Message local_80 [8];
  int local_78 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  size_t local_48;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> abcd_str;
  UnicodeFullTest_find_Test<std::pair<char8_t,_char>_> *this_local;
  
  jessilib::string_cast<char8_t,char32_t[5]>
            ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
             &gtest_ar.message_,(jessilib *)L"ABCD",in_RDX);
  jessilib::string_cast<char,char32_t[1]>(&local_68,(jessilib *)0x692abc,in_string);
  local_48 = jessilib::find<char8_t,char>
                       ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>
                         *)&gtest_ar.message_,&local_68);
  local_78[0] = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_40,
             "find(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"\"))","0",
             &local_48,local_78);
  std::__cxx11::string::~string((string *)&local_68);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(local_80);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x126,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  jessilib::string_cast<char,char32_t[2]>(&local_c0,(jessilib *)0x697ba4,in_string_00);
  local_a0 = jessilib::find<char8_t,char>
                       ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>
                         *)&gtest_ar.message_,&local_c0);
  local_c4 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_98,
             "find(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"A\"))","0",
             &local_a0,&local_c4);
  std::__cxx11::string::~string((string *)&local_c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x129,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  jessilib::string_cast<char,char32_t[2]>(&local_110,(jessilib *)0x697b5c,in_string_01);
  local_f0 = jessilib::find<char8_t,char>
                       ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>
                         *)&gtest_ar.message_,&local_110);
  local_114 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_e8,
             "find(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"B\"))","1",
             &local_f0,&local_114);
  std::__cxx11::string::~string((string *)&local_110);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(local_120);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x12a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  jessilib::string_cast<char,char32_t[2]>(&local_160,(jessilib *)0x697b68,in_string_02);
  local_140 = jessilib::find<char8_t,char>
                        ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>
                          *)&gtest_ar.message_,&local_160);
  local_164 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_138,
             "find(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"C\"))","2",
             &local_140,&local_164);
  std::__cxx11::string::~string((string *)&local_160);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(local_170);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,299,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  jessilib::string_cast<char,char32_t[2]>(&local_1b0,(jessilib *)0x697a08,in_string_03);
  local_190 = jessilib::find<char8_t,char>
                        ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>
                          *)&gtest_ar.message_,&local_1b0);
  local_1b4 = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_188,
             "find(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"D\"))","3",
             &local_190,&local_1b4);
  std::__cxx11::string::~string((string *)&local_1b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
  if (!bVar1) {
    testing::Message::Message(local_1c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,300,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(local_1c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
  jessilib::string_cast<char,char32_t[2]>(&local_200,(jessilib *)L"E",in_string_04);
  local_1e0 = jessilib::find<char8_t,char>
                        ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>
                          *)&gtest_ar.message_,&local_200);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_1d8,
             "find(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"E\"))",
             "decltype(abcd_str)::npos",&local_1e0,&std::__cxx11::u8string::npos);
  std::__cxx11::string::~string((string *)&local_200);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(local_208);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x12d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,local_208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  jessilib::string_cast<char,char32_t[3]>(&local_248,(jessilib *)L"AB",in_string_05);
  local_228 = jessilib::find<char8_t,char>
                        ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>
                          *)&gtest_ar.message_,&local_248);
  local_24c = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_220,
             "find(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"AB\"))","0",
             &local_228,&local_24c);
  std::__cxx11::string::~string((string *)&local_248);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
  if (!bVar1) {
    testing::Message::Message(local_258);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x130,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,local_258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  jessilib::string_cast<char,char32_t[3]>(&local_298,(jessilib *)L"BC",in_string_06);
  local_278 = jessilib::find<char8_t,char>
                        ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>
                          *)&gtest_ar.message_,&local_298);
  local_29c = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_270,
             "find(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"BC\"))","1",
             &local_278,&local_29c);
  std::__cxx11::string::~string((string *)&local_298);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar1) {
    testing::Message::Message(local_2a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x131,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,local_2a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(local_2a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  jessilib::string_cast<char,char32_t[3]>(&local_2e8,(jessilib *)0x697a04,in_string_07);
  local_2c8 = jessilib::find<char8_t,char>
                        ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>
                          *)&gtest_ar.message_,&local_2e8);
  local_2ec = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_2c0,
             "find(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"CD\"))","2",
             &local_2c8,&local_2ec);
  std::__cxx11::string::~string((string *)&local_2e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
  if (!bVar1) {
    testing::Message::Message(local_2f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x132,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(local_2f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
  jessilib::string_cast<char,char32_t[3]>(&local_338,(jessilib *)L"DA",in_string_08);
  local_318 = jessilib::find<char8_t,char>
                        ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>
                          *)&gtest_ar.message_,&local_338);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_310,
             "find(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"DA\"))",
             "decltype(abcd_str)::npos",&local_318,&std::__cxx11::u8string::npos);
  std::__cxx11::string::~string((string *)&local_338);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_310);
  if (!bVar1) {
    testing::Message::Message(local_340);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_310);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(double_abcd_str.field_2._M_local_buf + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x133,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(double_abcd_str.field_2._M_local_buf + 8),local_340);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)(double_abcd_str.field_2._M_local_buf + 8));
    testing::Message::~Message(local_340);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
  jessilib::string_cast<char8_t,char32_t[9]>
            ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
             &gtest_ar_10.message_,(jessilib *)L"AABBCCDD",in_string_09);
  jessilib::string_cast<char,char32_t[2]>(&local_3a0,(jessilib *)0x697ba4,in_string_10);
  local_380 = jessilib::find<char8_t,char>
                        ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>
                          *)&gtest_ar_10.message_,&local_3a0);
  local_3a4 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_378,
             "find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"A\"))"
             ,"0",&local_380,&local_3a4);
  std::__cxx11::string::~string((string *)&local_3a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_378);
  if (!bVar1) {
    testing::Message::Message(local_3b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_378);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x138,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,local_3b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(local_3b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
  jessilib::string_cast<char,char32_t[2]>(&local_3f0,(jessilib *)0x697b5c,in_string_11);
  local_3d0 = jessilib::find<char8_t,char>
                        ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>
                          *)&gtest_ar_10.message_,&local_3f0);
  local_3f4 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_3c8,
             "find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"B\"))"
             ,"2",&local_3d0,&local_3f4);
  std::__cxx11::string::~string((string *)&local_3f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c8);
  if (!bVar1) {
    testing::Message::Message(local_400);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x139,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,local_400);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(local_400);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c8);
  jessilib::string_cast<char,char32_t[2]>(&local_440,(jessilib *)0x697b68,in_string_12);
  local_420 = jessilib::find<char8_t,char>
                        ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>
                          *)&gtest_ar_10.message_,&local_440);
  local_444 = 4;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_418,
             "find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"C\"))"
             ,"4",&local_420,&local_444);
  std::__cxx11::string::~string((string *)&local_440);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_418);
  if (!bVar1) {
    testing::Message::Message(local_450);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_418);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x13a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,local_450);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(local_450);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_418);
  jessilib::string_cast<char,char32_t[2]>(&local_490,(jessilib *)0x697a08,in_string_13);
  local_470 = jessilib::find<char8_t,char>
                        ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>
                          *)&gtest_ar_10.message_,&local_490);
  local_494 = 6;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_468,
             "find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"D\"))"
             ,"6",&local_470,&local_494);
  std::__cxx11::string::~string((string *)&local_490);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_468);
  if (!bVar1) {
    testing::Message::Message(local_4a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_468);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x13b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,local_4a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(local_4a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_468);
  jessilib::string_cast<char,char32_t[2]>(&local_4e0,(jessilib *)L"E",in_string_14);
  local_4c0 = jessilib::find<char8_t,char>
                        ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>
                          *)&gtest_ar_10.message_,&local_4e0);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_4b8,
             "find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"E\"))"
             ,"decltype(double_abcd_str)::npos",&local_4c0,&std::__cxx11::u8string::npos);
  std::__cxx11::string::~string((string *)&local_4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b8);
  if (!bVar1) {
    testing::Message::Message(local_4e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x13c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,local_4e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(local_4e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b8);
  jessilib::string_cast<char,char32_t[3]>(&local_528,(jessilib *)L"AA",in_string_15);
  local_508 = jessilib::find<char8_t,char>
                        ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>
                          *)&gtest_ar_10.message_,&local_528);
  local_52c = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_500,
             "find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"AA\"))"
             ,"0",&local_508,&local_52c);
  std::__cxx11::string::~string((string *)&local_528);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
  if (!bVar1) {
    testing::Message::Message(local_538);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_500);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x13f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,local_538);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(local_538);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
  jessilib::string_cast<char,char32_t[3]>(&local_578,(jessilib *)L"AB",in_string_16);
  local_558 = jessilib::find<char8_t,char>
                        ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>
                          *)&gtest_ar_10.message_,&local_578);
  local_57c = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_550,
             "find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"AB\"))"
             ,"1",&local_558,&local_57c);
  std::__cxx11::string::~string((string *)&local_578);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_550);
  if (!bVar1) {
    testing::Message::Message(local_588);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_550);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x140,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,local_588);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(local_588);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_550);
  jessilib::string_cast<char,char32_t[3]>(&local_5c8,(jessilib *)L"BB",in_string_17);
  local_5a8 = jessilib::find<char8_t,char>
                        ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>
                          *)&gtest_ar_10.message_,&local_5c8);
  local_5cc = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_5a0,
             "find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"BB\"))"
             ,"2",&local_5a8,&local_5cc);
  std::__cxx11::string::~string((string *)&local_5c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5a0);
  if (!bVar1) {
    testing::Message::Message(local_5d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x141,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,local_5d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(local_5d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5a0);
  jessilib::string_cast<char,char32_t[3]>(&local_618,(jessilib *)L"BC",in_string_18);
  local_5f8 = jessilib::find<char8_t,char>
                        ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>
                          *)&gtest_ar_10.message_,&local_618);
  local_61c = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_5f0,
             "find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"BC\"))"
             ,"3",&local_5f8,&local_61c);
  std::__cxx11::string::~string((string *)&local_618);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5f0);
  if (!bVar1) {
    testing::Message::Message(local_628);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x142,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,local_628);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(local_628);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5f0);
  jessilib::string_cast<char,char32_t[3]>(&local_668,(jessilib *)L"CC",in_string_19);
  local_648 = jessilib::find<char8_t,char>
                        ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>
                          *)&gtest_ar_10.message_,&local_668);
  local_66c = 4;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_640,
             "find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"CC\"))"
             ,"4",&local_648,&local_66c);
  std::__cxx11::string::~string((string *)&local_668);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_640);
  if (!bVar1) {
    testing::Message::Message(local_678);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_640);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x143,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,local_678);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(local_678);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_640);
  jessilib::string_cast<char,char32_t[3]>(&local_6b8,(jessilib *)0x697a04,in_string_20);
  local_698 = jessilib::find<char8_t,char>
                        ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>
                          *)&gtest_ar_10.message_,&local_6b8);
  local_6bc = 5;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_690,
             "find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"CD\"))"
             ,"5",&local_698,&local_6bc);
  std::__cxx11::string::~string((string *)&local_6b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_690);
  if (!bVar1) {
    testing::Message::Message(local_6c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_690);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x144,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,local_6c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(local_6c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_690);
  jessilib::string_cast<char,char32_t[3]>(&local_708,(jessilib *)0x697b94,in_string_21);
  local_6e8 = jessilib::find<char8_t,char>
                        ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>
                          *)&gtest_ar_10.message_,&local_708);
  local_70c = 6;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_6e0,
             "find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"DD\"))"
             ,"6",&local_6e8,&local_70c);
  std::__cxx11::string::~string((string *)&local_708);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6e0);
  if (!bVar1) {
    testing::Message::Message(local_718);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x145,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,local_718);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(local_718);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6e0);
  jessilib::string_cast<char,char32_t[3]>(&local_758,(jessilib *)L"DA",in_string_22);
  local_738 = jessilib::find<char8_t,char>
                        ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>
                          *)&gtest_ar_10.message_,&local_758);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_730,
             "find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"DA\"))"
             ,"decltype(double_abcd_str)::npos",&local_738,&std::__cxx11::u8string::npos);
  std::__cxx11::string::~string((string *)&local_758);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_730);
  if (!bVar1) {
    testing::Message::Message(local_760);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_730);
    testing::internal::AssertHelper::AssertHelper
              (local_768,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x146,pcVar2);
    testing::internal::AssertHelper::operator=(local_768,local_760);
    testing::internal::AssertHelper::~AssertHelper(local_768);
    testing::Message::~Message(local_760);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_730);
  std::__cxx11::u8string::~u8string((u8string *)&gtest_ar_10.message_);
  std::__cxx11::u8string::~u8string((u8string *)&gtest_ar.message_);
  return;
}

Assistant:

TYPED_TEST(UnicodeFullTest, find) {
	auto abcd_str = jessilib::string_cast<typename TypeParam::first_type>(U"ABCD");

	// Empty substring
	EXPECT_EQ(find(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"")), 0);

	// Single-characters
	EXPECT_EQ(find(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"A")), 0);
	EXPECT_EQ(find(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"B")), 1);
	EXPECT_EQ(find(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"C")), 2);
	EXPECT_EQ(find(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"D")), 3);
	EXPECT_EQ(find(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"E")), decltype(abcd_str)::npos);

	// Two characters
	EXPECT_EQ(find(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"AB")), 0);
	EXPECT_EQ(find(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"BC")), 1);
	EXPECT_EQ(find(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"CD")), 2);
	EXPECT_EQ(find(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"DA")), decltype(abcd_str)::npos);

	auto double_abcd_str = jessilib::string_cast<typename TypeParam::first_type>(U"AABBCCDD");

	// Single-characters
	EXPECT_EQ(find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"A")), 0);
	EXPECT_EQ(find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"B")), 2);
	EXPECT_EQ(find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"C")), 4);
	EXPECT_EQ(find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"D")), 6);
	EXPECT_EQ(find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"E")), decltype(double_abcd_str)::npos);

	// Two characters
	EXPECT_EQ(find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"AA")), 0);
	EXPECT_EQ(find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"AB")), 1);
	EXPECT_EQ(find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"BB")), 2);
	EXPECT_EQ(find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"BC")), 3);
	EXPECT_EQ(find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"CC")), 4);
	EXPECT_EQ(find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"CD")), 5);
	EXPECT_EQ(find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"DD")), 6);
	EXPECT_EQ(find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"DA")), decltype(double_abcd_str)::npos);
}